

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL>::SmallVector
          (SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>).firstElement;
  (this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>).len = 0;
  (this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>).cap = 5;
  SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::reserve
            (&this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }